

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_seed.c
# Opt level: O1

long sd_supp(int child,long skip_count)

{
  NthElement(skip_count,&Seed[0x21].value);
  Seed[0x21].nCalls = Seed[0x21].nCalls + skip_count;
  NthElement(skip_count * 3,&Seed[0x22].value);
  Seed[0x22].nCalls = Seed[0x22].nCalls + skip_count * 3;
  NthElement(skip_count,&Seed[0x23].value);
  Seed[0x23].nCalls = Seed[0x23].nCalls + skip_count;
  NthElement(skip_count * 9,&Seed[0x20].value);
  Seed[0x20].nCalls = Seed[0x20].nCalls + skip_count * 9;
  NthElement(skip_count * 2,&Seed[0x24].value);
  Seed[0x24].nCalls = Seed[0x24].nCalls + skip_count * 2;
  NthElement(skip_count,&Seed[0x2e].value);
  Seed[0x2e].nCalls = Seed[0x2e].nCalls + skip_count;
  NthElement(skip_count,&Seed[0x2c].value);
  Seed[0x2c].nCalls = Seed[0x2c].nCalls + skip_count;
  NthElement(skip_count,&Seed[0x2f].value);
  Seed[0x2f].nCalls = Seed[0x2f].nCalls + skip_count;
  NthElement(skip_count,&Seed[0x2d].value);
  Seed[0x2d].nCalls = Seed[0x2d].nCalls + skip_count;
  return 0;
}

Assistant:

long
sd_supp(int child, DSS_HUGE skip_count)
{
   UNUSED(child);
   ADVANCE_STREAM(S_NTRG_SD, skip_count);
   ADVANCE_STREAM(S_PHNE_SD, 3L * skip_count);
   ADVANCE_STREAM(S_ABAL_SD, skip_count);
   ADVANCE_STREAM(S_ADDR_SD, skip_count * 9);
   ADVANCE_STREAM(S_CMNT_SD, skip_count * 2);
   ADVANCE_STREAM(BBB_CMNT_SD, skip_count);
   ADVANCE_STREAM(BBB_JNK_SD, skip_count);
   ADVANCE_STREAM(BBB_OFFSET_SD, skip_count);
   ADVANCE_STREAM(BBB_TYPE_SD, skip_count);      /* avoid one trudge */
   
   return(0L);
}